

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tenor_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::TenorTest_test_valid_near_far_tenor_validation_Test::TestBody
          (TenorTest_test_valid_near_far_tenor_validation_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_140;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_48;
  Message local_40 [3];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  TenorTest_test_valid_near_far_tenor_validation_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  local_21 = (bool)bidfx_public_api::Tenor::IsValidNearFarTenor
                             ((Tenor *)&Tenor::TODAY,(Tenor *)&Tenor::TOMORROW);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)"Tenor::IsValidNearFarTenor(Tenor::TODAY, Tenor::TOMORROW)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/tenor_test.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_79 = (bool)bidfx_public_api::Tenor::IsValidNearFarTenor
                             ((Tenor *)&Tenor::TODAY,(Tenor *)&Tenor::IN_1_WEEK);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_78,
               (AssertionResult *)"Tenor::IsValidNearFarTenor(Tenor::TODAY, Tenor::IN_1_WEEK)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/tenor_test.cpp"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_c1 = (bool)bidfx_public_api::Tenor::IsValidNearFarTenor
                             ((Tenor *)&Tenor::SPOT,(Tenor *)&Tenor::IN_1_YEAR);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_c0,
               (AssertionResult *)"Tenor::IsValidNearFarTenor(Tenor::SPOT, Tenor::IN_1_YEAR)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/tenor_test.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_109 = (bool)bidfx_public_api::Tenor::IsValidNearFarTenor
                              ((Tenor *)&Tenor::IN_11_MONTHS,(Tenor *)&Tenor::IN_1_YEAR);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_140,(internal *)local_108,
               (AssertionResult *)
               "Tenor::IsValidNearFarTenor(Tenor::IN_11_MONTHS, Tenor::IN_1_YEAR)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/tenor_test.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  return;
}

Assistant:

TEST(TenorTest, test_valid_near_far_tenor_validation)
{
    EXPECT_TRUE(Tenor::IsValidNearFarTenor(Tenor::TODAY, Tenor::TOMORROW));
    EXPECT_TRUE(Tenor::IsValidNearFarTenor(Tenor::TODAY, Tenor::IN_1_WEEK));
    EXPECT_TRUE(Tenor::IsValidNearFarTenor(Tenor::SPOT, Tenor::IN_1_YEAR));
    EXPECT_TRUE(Tenor::IsValidNearFarTenor(Tenor::IN_11_MONTHS, Tenor::IN_1_YEAR));
}